

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameter.cpp
# Opt level: O1

void CoreMLConverter::convertCaffeParameter(ConvertLayerParameters layerParameters)

{
  RepeatedField<unsigned_long> *this;
  int **ppiVar1;
  RepeatedField<float> *this_00;
  uint uVar2;
  ConvolutionLayerParams *pCVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  string *layerName;
  long lVar7;
  void *pvVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  Type *pTVar12;
  Type *this_01;
  LogMessage *pLVar13;
  BlobShape *pBVar14;
  LoadConstantLayerParams *this_02;
  unsigned_long *puVar15;
  long *plVar16;
  undefined8 *puVar17;
  WeightParams *this_03;
  uint uVar18;
  long *plVar19;
  ulong *puVar20;
  size_type *psVar21;
  ulong uVar22;
  uint uVar23;
  uint uVar24;
  ParameterParameter *pPVar25;
  uint new_size;
  long in_stack_00000008;
  long in_stack_00000010;
  RepeatedPtrFieldBase *in_stack_00000018;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_00000028;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *in_stack_00000030;
  string __str_1;
  string __str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bottom;
  undefined1 local_1f0 [56];
  Type *local_1b8;
  ulong *local_1b0;
  long local_1a8;
  ulong local_1a0 [2];
  ulong *local_190;
  long local_188;
  ulong local_180;
  long lStack_178;
  long *local_170;
  long local_168;
  long local_160;
  long lStack_158;
  undefined1 local_150 [16];
  int *local_140;
  _Alloc_hider _Stack_138;
  long *local_118 [2];
  long local_108 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  Type *local_e0;
  string local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  LogMessage local_a0;
  LogMessage local_68;
  
  pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                      ((RepeatedPtrFieldBase *)(in_stack_00000008 + 0x70),
                       *(int *)__str_1._M_dataplus._M_p);
  iVar10 = getLayerIndex(pTVar12,in_stack_00000030);
  local_1b8 = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                        ((RepeatedPtrFieldBase *)(in_stack_00000010 + 0x70),iVar10);
  this_01 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      (in_stack_00000018,(Type *)0x0);
  if ((pTVar12->top_).super_RepeatedPtrFieldBase.current_size_ != 1) {
    local_1f0._0_8_ = local_1f0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"Must have 1 output","");
    errorInCaffeProto((string *)local_1f0,(pTVar12->name_).ptr_,(pTVar12->type_).ptr_);
    if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
      operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
    }
  }
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((pTVar12->top_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar13 = google::protobuf::internal::LogMessage::operator<<
                        (&local_a0,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_1f0,pLVar13);
    google::protobuf::internal::LogMessage::~LogMessage(&local_a0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_f8,(value_type *)((pTVar12->top_).super_RepeatedPtrFieldBase.rep_)->elements[0]
             );
  convertCaffeMetadata
            ((pTVar12->name_).ptr_,&local_b8,&local_f8,
             (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)in_stack_00000018,
             in_stack_00000028);
  pPVar25 = pTVar12->parameter_param_;
  if (pPVar25 == (ParameterParameter *)0x0) {
    pPVar25 = (ParameterParameter *)&caffe::_ParameterParameter_default_instance_;
  }
  if (((pPVar25->_has_bits_).has_bits_[0] & 1) == 0) {
    local_1f0._0_8_ = local_1f0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1f0,"Must have \'shape\' set","");
    errorInCaffeProto((string *)local_1f0,(pTVar12->name_).ptr_,(pTVar12->type_).ptr_);
    if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
      operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
    }
  }
  pBVar14 = pPVar25->shape_;
  if (pBVar14 == (BlobShape *)0x0) {
    pBVar14 = (BlobShape *)&caffe::_BlobShape_default_instance_;
  }
  if (1 < (pBVar14->dim_).current_size_ - 3U) {
    local_1f0._0_8_ = local_1f0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1f0,"\'shape\' must be either 3 or 4 dimensions","");
    errorInCaffeProto((string *)local_1f0,(pTVar12->name_).ptr_,(pTVar12->type_).ptr_);
    if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
      operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
    }
  }
  pBVar14 = pPVar25->shape_;
  if (pBVar14 == (BlobShape *)0x0) {
    pBVar14 = (BlobShape *)&caffe::_BlobShape_default_instance_;
  }
  if (((pBVar14->dim_).current_size_ == 4) && (((pBVar14->dim_).rep_)->elements[0] != 1)) {
    local_1f0._0_8_ = local_1f0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1f0,"if \'shape\' is of 4 dimesnions, first one must be 1","");
    errorInCaffeProto((string *)local_1f0,(pTVar12->name_).ptr_,(pTVar12->type_).ptr_);
    if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
      operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
    }
  }
  if ((local_1b8->blobs_).super_RepeatedPtrFieldBase.current_size_ != 1) {
    local_1f0._0_8_ = local_1f0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1f0,"Must have 1 weight blob","");
    errorInCaffeProto((string *)local_1f0,(pTVar12->name_).ptr_,(pTVar12->type_).ptr_);
    if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
      operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
    }
  }
  if (this_01->_oneof_case_[0] != 0x122) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_01);
    this_01->_oneof_case_[0] = 0x122;
    this_02 = (LoadConstantLayerParams *)operator_new(0x38);
    CoreML::Specification::LoadConstantLayerParams::LoadConstantLayerParams(this_02);
    (this_01->layer_).loadconstant_ = this_02;
  }
  pBVar14 = pPVar25->shape_;
  if (pBVar14 == (BlobShape *)0x0) {
    pBVar14 = (BlobShape *)&caffe::_BlobShape_default_instance_;
  }
  pCVar3 = (this_01->layer_).convolution_;
  iVar10 = (pBVar14->dim_).current_size_;
  puVar15 = (unsigned_long *)google::protobuf::RepeatedField<long>::Get(&pBVar14->dim_,iVar10 + -3);
  pBVar14 = pPVar25->shape_;
  if (pBVar14 == (BlobShape *)0x0) {
    pBVar14 = (BlobShape *)&caffe::_BlobShape_default_instance_;
  }
  uVar4 = *puVar15;
  puVar15 = (unsigned_long *)google::protobuf::RepeatedField<long>::Get(&pBVar14->dim_,iVar10 + -2);
  pBVar14 = pPVar25->shape_;
  if (pBVar14 == (BlobShape *)0x0) {
    pBVar14 = (BlobShape *)&caffe::_BlobShape_default_instance_;
  }
  uVar5 = *puVar15;
  puVar15 = (unsigned_long *)google::protobuf::RepeatedField<long>::Get(&pBVar14->dim_,iVar10 + -1);
  if ((long)uVar4 < 0) {
    __assert_fail("c >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Parameter.cpp"
                  ,0x3b,
                  "void CoreMLConverter::convertCaffeParameter(CoreMLConverter::ConvertLayerParameters)"
                 );
  }
  uVar6 = *puVar15;
  this = &pCVar3->kernelsize_;
  iVar10 = (pCVar3->kernelsize_).total_size_;
  if ((pCVar3->kernelsize_).current_size_ == iVar10) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(this,iVar10 + 1);
  }
  iVar10 = (pCVar3->kernelsize_).current_size_;
  iVar11 = iVar10 + 1;
  (pCVar3->kernelsize_).current_size_ = iVar11;
  ((pCVar3->kernelsize_).rep_)->elements[iVar10] = uVar4;
  if ((long)uVar5 < 0) {
    __assert_fail("h >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Parameter.cpp"
                  ,0x3d,
                  "void CoreMLConverter::convertCaffeParameter(CoreMLConverter::ConvertLayerParameters)"
                 );
  }
  iVar10 = (pCVar3->kernelsize_).total_size_;
  if (iVar11 == iVar10) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(this,iVar10 + 1);
  }
  iVar10 = (pCVar3->kernelsize_).current_size_;
  iVar11 = iVar10 + 1;
  (pCVar3->kernelsize_).current_size_ = iVar11;
  ((pCVar3->kernelsize_).rep_)->elements[iVar10] = uVar5;
  if ((long)uVar6 < 0) {
    __assert_fail("w >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Parameter.cpp"
                  ,0x3f,
                  "void CoreMLConverter::convertCaffeParameter(CoreMLConverter::ConvertLayerParameters)"
                 );
  }
  iVar10 = (pCVar3->kernelsize_).total_size_;
  if (iVar11 == iVar10) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(this,iVar10 + 1);
  }
  iVar10 = (pCVar3->kernelsize_).current_size_;
  (pCVar3->kernelsize_).current_size_ = iVar10 + 1;
  ((pCVar3->kernelsize_).rep_)->elements[iVar10] = uVar6;
  local_e0 = pTVar12;
  if ((local_1b8->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar13 = google::protobuf::internal::LogMessage::operator<<
                        (&local_68,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_1f0,pLVar13);
    google::protobuf::internal::LogMessage::~LogMessage(&local_68);
  }
  new_size = (int)uVar5 * (int)uVar4 * (int)uVar6;
  uVar2 = *(uint *)((long)((local_1b8->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x18)
  ;
  if (uVar2 == new_size) goto LAB_003e1f38;
  uVar23 = -new_size;
  if (0 < (int)new_size) {
    uVar23 = new_size;
  }
  uVar24 = 1;
  if (9 < uVar23) {
    uVar22 = (ulong)uVar23;
    uVar9 = 4;
    do {
      uVar24 = uVar9;
      uVar18 = (uint)uVar22;
      if (uVar18 < 100) {
        uVar24 = uVar24 - 2;
        goto LAB_003e1b73;
      }
      if (uVar18 < 1000) {
        uVar24 = uVar24 - 1;
        goto LAB_003e1b73;
      }
      if (uVar18 < 10000) goto LAB_003e1b73;
      uVar22 = uVar22 / 10000;
      uVar9 = uVar24 + 4;
    } while (99999 < uVar18);
    uVar24 = uVar24 + 1;
  }
LAB_003e1b73:
  local_118[0] = local_108;
  std::__cxx11::string::_M_construct((ulong)local_118,(char)-((int)new_size >> 0x1f) + (char)uVar24)
  ;
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uint)-((int)new_size >> 0x1f) + (long)local_118[0]),uVar24,uVar23);
  plVar16 = (long *)std::__cxx11::string::replace((ulong)local_118,0,(char *)0x0,0x5fe537);
  local_170 = &local_160;
  plVar19 = plVar16 + 2;
  if ((long *)*plVar16 == plVar19) {
    local_160 = *plVar19;
    lStack_158 = plVar16[3];
  }
  else {
    local_160 = *plVar19;
    local_170 = (long *)*plVar16;
  }
  local_168 = plVar16[1];
  *plVar16 = (long)plVar19;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  plVar16 = (long *)std::__cxx11::string::append((char *)&local_170);
  puVar20 = (ulong *)(plVar16 + 2);
  if ((ulong *)*plVar16 == puVar20) {
    local_180 = *puVar20;
    lStack_178 = plVar16[3];
    local_190 = &local_180;
  }
  else {
    local_180 = *puVar20;
    local_190 = (ulong *)*plVar16;
  }
  local_188 = plVar16[1];
  *plVar16 = (long)puVar20;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  uVar23 = -uVar2;
  if (0 < (int)uVar2) {
    uVar23 = uVar2;
  }
  uVar24 = 1;
  if (9 < uVar23) {
    uVar22 = (ulong)uVar23;
    uVar9 = 4;
    do {
      uVar24 = uVar9;
      uVar18 = (uint)uVar22;
      if (uVar18 < 100) {
        uVar24 = uVar24 - 2;
        goto LAB_003e1cd6;
      }
      if (uVar18 < 1000) {
        uVar24 = uVar24 - 1;
        goto LAB_003e1cd6;
      }
      if (uVar18 < 10000) goto LAB_003e1cd6;
      uVar22 = uVar22 / 10000;
      uVar9 = uVar24 + 4;
    } while (99999 < uVar18);
    uVar24 = uVar24 + 1;
  }
LAB_003e1cd6:
  local_1b0 = local_1a0;
  std::__cxx11::string::_M_construct((ulong)&local_1b0,(char)uVar24 - (char)((int)uVar2 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar2 >> 0x1f) + (long)local_1b0),uVar24,uVar23);
  pTVar12 = local_e0;
  uVar22 = 0xf;
  if (local_190 != &local_180) {
    uVar22 = local_180;
  }
  if (uVar22 < (ulong)(local_1a8 + local_188)) {
    uVar22 = 0xf;
    if (local_1b0 != local_1a0) {
      uVar22 = local_1a0[0];
    }
    if (uVar22 < (ulong)(local_1a8 + local_188)) goto LAB_003e1d55;
    puVar17 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_1b0,0,(char *)0x0,(ulong)local_190);
  }
  else {
LAB_003e1d55:
    puVar17 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_190,(ulong)local_1b0);
  }
  local_150._0_8_ = &local_140;
  ppiVar1 = (int **)(puVar17 + 2);
  if ((int **)*puVar17 == ppiVar1) {
    local_140 = *ppiVar1;
    _Stack_138._M_p = (pointer)puVar17[3];
  }
  else {
    local_140 = *ppiVar1;
    local_150._0_8_ = (int **)*puVar17;
  }
  local_150._8_8_ = puVar17[1];
  *puVar17 = ppiVar1;
  puVar17[1] = 0;
  *(undefined1 *)ppiVar1 = 0;
  plVar16 = (long *)std::__cxx11::string::append(local_150);
  psVar21 = (size_type *)(plVar16 + 2);
  if ((size_type *)*plVar16 == psVar21) {
    local_1f0._16_8_ = *psVar21;
    local_1f0._24_4_ = (undefined4)plVar16[3];
    local_1f0._28_4_ = *(undefined4 *)((long)plVar16 + 0x1c);
    local_1f0._0_8_ = local_1f0 + 0x10;
  }
  else {
    local_1f0._16_8_ = *psVar21;
    local_1f0._0_8_ = (size_type *)*plVar16;
  }
  local_1f0._8_8_ = plVar16[1];
  *plVar16 = (long)psVar21;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  layerName = (pTVar12->name_).ptr_;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Inner Product","");
  errorInCaffeProto((string *)local_1f0,layerName,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
    operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
  }
  if ((int **)local_150._0_8_ != &local_140) {
    operator_delete((void *)local_150._0_8_,(long)local_140 + 1);
  }
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0,local_1a0[0] + 1);
  }
  if (local_190 != &local_180) {
    operator_delete(local_190,local_180 + 1);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170,local_160 + 1);
  }
  if (local_118[0] != local_108) {
    operator_delete(local_118[0],local_108[0] + 1);
  }
LAB_003e1f38:
  lVar7._0_4_ = (pCVar3->stride_).current_size_;
  lVar7._4_4_ = (pCVar3->stride_).total_size_;
  if (lVar7 == 0) {
    this_03 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(this_03);
    *(WeightParams **)&pCVar3->stride_ = this_03;
  }
  lVar7 = *(long *)&pCVar3->stride_;
  if ((int)new_size < 0) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_150,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x46a);
    pLVar13 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_150,"CHECK failed: (new_size) >= (0): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_1f0,pLVar13);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_150);
  }
  this_00 = (RepeatedField<float> *)(lVar7 + 0x10);
  if (this_00->current_size_ < (int)new_size) {
    google::protobuf::RepeatedField<float>::Reserve(this_00,new_size);
    uVar2 = this_00->current_size_;
    if (uVar2 != new_size) {
      memset((void *)(*(long *)(lVar7 + 0x18) + (long)(int)uVar2 * 4 + 8),0,
             (long)(int)new_size * 4 + (long)(int)uVar2 * -4);
    }
  }
  this_00->current_size_ = new_size;
  if ((local_1b8->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_1f0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar13 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_1f0,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_190,pLVar13);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_1f0);
  }
  pvVar8 = ((local_1b8->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0];
  if ((RepeatedField<float> *)((long)pvVar8 + 0x18) != this_00) {
    this_00->current_size_ = 0;
    iVar10 = ((RepeatedField<float> *)((long)pvVar8 + 0x18))->current_size_;
    if (iVar10 != 0) {
      google::protobuf::RepeatedField<float>::Reserve(this_00,iVar10);
      memcpy((void *)(*(long *)(lVar7 + 0x18) + (long)*(int *)(lVar7 + 0x10) * 4 + 8),
             (void *)(*(long *)((long)pvVar8 + 0x20) + 8),(long)*(int *)((long)pvVar8 + 0x18) << 2);
      *(int *)(lVar7 + 0x10) = *(int *)(lVar7 + 0x10) + *(int *)((long)pvVar8 + 0x18);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b8);
  return;
}

Assistant:

void CoreMLConverter::convertCaffeParameter(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    int layerIdWeights = CoreMLConverter::getLayerIndex(caffeLayer,layerParameters.mapCaffeLayerNamesToIndex);
    const caffe::LayerParameter& caffeLayerWeights = layerParameters.protoweights.layer(layerIdWeights);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;
   
    //Write Layer metadata
    auto* nnWrite = layerParameters.nnWrite;
    Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
    if (caffeLayer.top_size() != 1) {
        CoreMLConverter::errorInCaffeProto("Must have 1 output",caffeLayer.name(),caffeLayer.type());
    }
    std::vector<std::string> bottom;
    std::vector<std::string> top;
    top.push_back(caffeLayer.top(0));
    CoreMLConverter::convertCaffeMetadata(caffeLayer.name(), 
                                         bottom, top,
                                         nnWrite, mappingDataBlobNames);
    
    const caffe::ParameterParameter& caffeLayerParams = caffeLayer.parameter_param();
    //***************** Some Error Checking in Caffe Proto **********
    if (!caffeLayerParams.has_shape()){
        CoreMLConverter::errorInCaffeProto("Must have 'shape' set", caffeLayer.name(), caffeLayer.type());
    }
    if (! (caffeLayerParams.shape().dim_size() == 3 || caffeLayerParams.shape().dim_size() == 4)){
        CoreMLConverter::errorInCaffeProto("'shape' must be either 3 or 4 dimensions",caffeLayer.name(), caffeLayer.type());
    }
    if (caffeLayerParams.shape().dim_size() == 4 && caffeLayerParams.shape().dim(0) != 1){
        CoreMLConverter::errorInCaffeProto("if 'shape' is of 4 dimesnions, first one must be 1",caffeLayer.name(), caffeLayer.type());
    }
    if (caffeLayerWeights.blobs_size() != 1){
        CoreMLConverter::errorInCaffeProto("Must have 1 weight blob",caffeLayer.name(), caffeLayer.type());
    }
    //***************************************************************
    Specification::LoadConstantLayerParams* specLayerParams = specLayer->mutable_loadconstant();
    int dim = caffeLayerParams.shape().dim_size();
    int64_t c = caffeLayerParams.shape().dim(dim-3);
    int64_t h = caffeLayerParams.shape().dim(dim-2);
    int64_t w = caffeLayerParams.shape().dim(dim-1);
    assert(c >= 0);
    specLayerParams->add_shape(static_cast<uint64_t>(c));
    assert(h >= 0);
    specLayerParams->add_shape(static_cast<uint64_t>(h));
    assert(w >= 0);
    specLayerParams->add_shape(static_cast<uint64_t>(w));

    int blobSize = static_cast<int> (c*h*w);
    int caffeBlobSize = caffeLayerWeights.blobs(0).data_size();
    if (caffeBlobSize != blobSize){
        CoreMLConverter::errorInCaffeProto("Expected blob size = "+std::to_string(blobSize)+" but found blob of size = "+
                        std::to_string(caffeBlobSize)+" in caffe", caffeLayer.name(), "Inner Product");
    }
    ::google::protobuf::RepeatedField<float>* dataWrite = specLayerParams->mutable_data()->mutable_floatvalue();
    dataWrite->Resize(blobSize, 0.0);
    dataWrite->CopyFrom(caffeLayerWeights.blobs(0).data());
}